

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseResidency.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sparse::anon_unknown_4::ImageSparseResidencyInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSparseResidencyInstance *this)

{
  UVec3 *imageSize;
  int *piVar1;
  TextureFormat TVar2;
  VkImageAspectFlags VVar3;
  uint uVar4;
  Handle<(vk::HandleType)7> vk;
  VkDeviceSize VVar5;
  VkDeviceSize VVar6;
  VkDeviceSize VVar7;
  Handle<(vk::HandleType)7> HVar8;
  VkDevice pVVar9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  deUint32 srcQueueFamilyIndex;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  undefined8 image;
  undefined8 commandBuffer;
  void *pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  TextureFormat buffer;
  bool bVar13;
  deUint32 dVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  VkResult result;
  VkImageViewType imageViewType;
  VkFormat format;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar23;
  Queue *pQVar24;
  Handle<(vk::HandleType)7> HVar25;
  Handle<(vk::HandleType)7> *pHVar26;
  deUint64 *pdVar27;
  DescriptorSetLayoutBuilder *this_01;
  const_iterator cVar28;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  NotSupportedError *pNVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  deUint32 dVar41;
  ulong uVar42;
  ulong uVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  int z;
  int iVar51;
  VkExtent3D VVar52;
  VkDeviceSize in_stack_fffffffffffff7a8;
  uint local_848;
  VkBufferCreateInfo outputBufferCreateInfo;
  pointer pVStack_7e0;
  pointer local_7d8;
  ulong local_7a0;
  long *local_790;
  long local_788;
  long local_780 [2];
  uint local_770;
  uint local_76c;
  TextureFormat *local_768;
  ulong local_760;
  ulong local_758;
  ulong local_750;
  ulong local_748;
  TextureFormat local_740;
  VkSparseImageMemoryBindInfo imageResidencyBindInfo;
  UVec4 referenceValue;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> imageMipTailMemoryBinds;
  VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;
  vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
  imageResidencyMemoryBinds;
  UVec3 gridSize;
  ConstPixelBufferAccess pixelBuffer;
  VkOffset3D offset;
  undefined4 uStack_5fc;
  uint local_5c0;
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  sparseMemoryRequirements;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_560;
  Handle<(vk::HandleType)7> local_548;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_540;
  UVec4 outputValue;
  VkExtent3D extent;
  int iStack_50c;
  VkImageSubresource subresource;
  undefined4 uStack_4ec;
  undefined1 local_4d0 [28];
  VkExtent3D local_4b4;
  uint local_4a8;
  deUint32 local_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  deUint32 local_490;
  deUint32 *local_488;
  VkImageLayout local_480;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_450;
  VkSemaphore local_438;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_430;
  ulong local_418;
  ulong local_410;
  ulong local_408;
  VkPipelineStageFlags stageBits [1];
  VkDescriptorImageInfo sparseImageInfo;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_388;
  VkPhysicalDeviceProperties physicalDeviceProperties;
  
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceProperties(&physicalDeviceProperties,vk_00,physicalDevice);
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imageSize = &this->m_imageSize;
  bVar13 = isImageSizeSupported(vk_00,physicalDevice,this->m_imageType,imageSize);
  if (bVar13) {
    bVar13 = checkSparseSupportForImageType(vk_00,physicalDevice,this->m_imageType);
    if (bVar13) {
      local_4d0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      local_4d0._8_8_ = (void *)0x0;
      local_4d0._16_4_ = 3;
      local_4d0._20_4_ = mapImageType(this->m_imageType);
      local_768 = &this->m_format;
      local_4d0._24_4_ = ::vk::mapTextureFormat(local_768);
      getLayerSize(this->m_imageType,imageSize);
      local_4b4.width = outputBufferCreateInfo.sType;
      local_4b4.height = outputBufferCreateInfo._4_4_;
      local_4b4.depth = (uint)outputBufferCreateInfo.pNext;
      local_4a8 = 1;
      local_4a4 = getNumLayers(this->m_imageType,imageSize);
      local_480 = VK_IMAGE_LAYOUT_UNDEFINED;
      local_4a0._0_4_ = VK_SAMPLE_COUNT_1_BIT;
      local_4a0._4_4_ = VK_IMAGE_TILING_OPTIMAL;
      uStack_498._0_4_ = 9;
      uStack_498._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
      local_490 = 0;
      local_488 = (deUint32 *)0x0;
      if (this->m_imageType - IMAGE_TYPE_CUBE < 2) {
        local_4d0._16_4_ = local_4d0._16_4_ | 0x10;
      }
      bVar13 = checkSparseSupportForImageFormat(vk_00,physicalDevice,(VkImageCreateInfo *)local_4d0)
      ;
      if (bVar13) {
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        outputBufferCreateInfo._4_4_ = 0;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo.flags = 0;
        outputBufferCreateInfo._20_4_ = 0;
        pixelBuffer.m_format.order = RGBA;
        pixelBuffer.m_format.type = SNORM_INT16;
        std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ::emplace_back<vkt::sparse::QueueRequirements>
                  ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                    *)&outputBufferCreateInfo,(QueueRequirements *)&pixelBuffer);
        pixelBuffer.m_format.order = I;
        pixelBuffer.m_format.type = SNORM_INT16;
        std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ::emplace_back<vkt::sparse::QueueRequirements>
                  ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                    *)&outputBufferCreateInfo,(QueueRequirements *)&pixelBuffer);
        SparseResourcesBaseInstance::createDeviceSupportingQueues
                  (&this->super_SparseResourcesBaseInstance,
                   (QueueRequirementsVec *)&outputBufferCreateInfo);
        if (outputBufferCreateInfo._0_8_ != 0) {
          operator_delete((void *)outputBufferCreateInfo._0_8_,
                          outputBufferCreateInfo._16_8_ - outputBufferCreateInfo._0_8_);
        }
        vk.m_internal =
             (deUint64)
             (this->super_SparseResourcesBaseInstance).m_deviceDriver.
             super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
        pQVar23 = SparseResourcesBaseInstance::getQueue
                            (&this->super_SparseResourcesBaseInstance,8,0);
        pQVar24 = SparseResourcesBaseInstance::getQueue
                            (&this->super_SparseResourcesBaseInstance,2,0);
        ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&outputBufferCreateInfo,
                          (DeviceInterface *)vk.m_internal,
                          (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                          super_RefBase<vk::VkDevice_s_*>.m_data.object,
                          (VkImageCreateInfo *)local_4d0,(VkAllocationCallbacks *)0x0);
        image = outputBufferCreateInfo._0_8_;
        DStack_560.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        DStack_560.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
        DStack_560.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        ::vk::createSemaphore
                  ((Move<vk::Handle<(vk::HandleType)4>_> *)&outputBufferCreateInfo,
                   (DeviceInterface *)vk.m_internal,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
        DStack_430.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        DStack_430.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
        local_438.m_internal = outputBufferCreateInfo._0_8_;
        DStack_430.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&pixelBuffer,(DeviceInterface *)vk.m_internal,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkImage)image);
        if (physicalDeviceProperties.limits.sparseAddressSpaceSize < (ulong)pixelBuffer.m_format) {
          pNVar29 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar29,"Required memory size for sparse resource exceeds device limits",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                     ,0x108);
          __cxa_throw(pNVar29,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        ::vk::getImageSparseMemoryRequirements
                  (&sparseMemoryRequirements,(DeviceInterface *)vk.m_internal,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkImage)image);
        dVar14 = getSparseAspectRequirementsIndex(&sparseMemoryRequirements,1);
        if (dVar14 == 0xffffffff) {
          pNVar29 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar29,
                     "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                     ,0x114);
          __cxa_throw(pNVar29,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        VVar3 = sparseMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[dVar14].formatProperties.aspectMask;
        uVar18 = sparseMemoryRequirements.
                 super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                 ._M_impl.super__Vector_impl_data._M_start[dVar14].formatProperties.imageGranularity
                 .width;
        uVar38 = sparseMemoryRequirements.
                 super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                 ._M_impl.super__Vector_impl_data._M_start[dVar14].formatProperties.imageGranularity
                 .height;
        uVar4 = sparseMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[dVar14].formatProperties.imageGranularity.
                depth;
        uVar30 = sparseMemoryRequirements.
                 super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                 ._M_impl.super__Vector_impl_data._M_start[dVar14].formatProperties.flags;
        uVar37 = sparseMemoryRequirements.
                 super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                 ._M_impl.super__Vector_impl_data._M_start[dVar14].imageMipTailFirstLod;
        VVar5 = sparseMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[dVar14].imageMipTailSize;
        VVar6 = sparseMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[dVar14].imageMipTailOffset;
        VVar7 = sparseMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[dVar14].imageMipTailStride;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        imageMipTailMemoryBinds.
        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        imageMipTailMemoryBinds.
        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        imageMipTailMemoryBinds.
        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        dVar14 = findMatchingMemoryType
                           (vk_00,physicalDevice,(VkMemoryRequirements *)&pixelBuffer,
                            (MemoryRequirement *)&::vk::MemoryRequirement::Any);
        local_748 = CONCAT44(local_748._4_4_,uVar18);
        if (dVar14 == 0xffffffff) {
          outputBufferCreateInfo._0_8_ = &outputBufferCreateInfo.flags;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&outputBufferCreateInfo,"No matching memory type found","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,outputBufferCreateInfo._0_8_,
                     (long)outputBufferCreateInfo.pNext + outputBufferCreateInfo._0_8_);
          if ((VkBufferCreateFlags *)outputBufferCreateInfo._0_8_ != &outputBufferCreateInfo.flags)
          {
            operator_delete((void *)outputBufferCreateInfo._0_8_,outputBufferCreateInfo._16_8_ + 1);
          }
        }
        else {
          if (local_4a4 != 0) {
            local_7a0 = 0;
            local_5c0 = uVar30 & 1;
            do {
              if (uVar37 != 0) {
                dVar41 = 0;
                do {
                  subresource.mipLevel = dVar41;
                  subresource.aspectMask = VVar3;
                  stack0xfffffffffffffb10 = (void *)CONCAT44(uStack_4ec,(int)local_7a0);
                  VVar52 = mipLevelExtents(&local_4b4,dVar41);
                  uVar33 = VVar52._0_8_ & 0xffffffff;
                  uVar42 = VVar52._0_8_ >> 0x20;
                  uVar46 = (uint)(uVar42 % (ulong)uVar38);
                  local_76c = uVar46;
                  if (uVar46 == 0) {
                    local_76c = uVar38;
                  }
                  uVar48 = (uint)(uVar33 % (ulong)uVar18);
                  uVar45 = uVar48;
                  if (uVar48 == 0) {
                    uVar45 = uVar18;
                  }
                  uVar34 = VVar52.depth % uVar4;
                  local_770 = uVar34;
                  if (uVar34 == 0) {
                    local_770 = uVar4;
                  }
                  uVar34 = (uint)(uVar34 != 0) + VVar52.depth / uVar4;
                  if (uVar34 != 0) {
                    uVar48 = (int)(uVar33 / uVar18) + (uint)(uVar48 != 0);
                    uVar46 = (int)(uVar42 / uVar38) + (uint)(uVar46 != 0);
                    local_758 = (ulong)uVar46;
                    local_760 = 0;
                    do {
                      if ((uint)local_758 != 0) {
                        iVar44 = (int)local_760;
                        iVar15 = (uVar34 * (int)local_7a0 + iVar44) * (uint)local_758;
                        local_740.order = iVar44 * uVar4;
                        uVar17 = uVar4;
                        if (iVar44 == uVar34 - 1) {
                          uVar17 = local_770;
                        }
                        local_750 = 0;
                        do {
                          if (uVar48 != 0) {
                            iVar44 = (int)local_750;
                            uVar16 = uVar38;
                            if (iVar44 == uVar46 - 1) {
                              uVar16 = local_76c;
                            }
                            iVar49 = 0;
                            uVar36 = 0;
                            do {
                              if ((uVar36 + (iVar15 + iVar44) * uVar48 & 1) == 0) {
                                offset.y = iVar44 * uVar38;
                                offset.x = iVar49;
                                stack0xfffffffffffffa00 =
                                     (long *)CONCAT44(uStack_5fc,local_740.order);
                                if (uVar48 - 1 == uVar36) {
                                  uVar18 = uVar45;
                                }
                                extent.height = uVar16;
                                extent.width = uVar18;
                                stack0xfffffffffffffaf0 = (void *)CONCAT44(iStack_50c,uVar17);
                                makeSparseImageMemoryBind
                                          ((VkSparseImageMemoryBind *)&outputBufferCreateInfo,
                                           (DeviceInterface *)vk.m_internal,
                                           (this->super_SparseResourcesBaseInstance).m_logicalDevice
                                           .super_RefBase<vk::VkDevice_s_*>.m_data.object,
                                           pixelBuffer.m_size.m_data._0_8_,dVar14,&subresource,
                                           &offset,&extent);
                                HVar25.m_internal =
                                     (deUint64)
                                     ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                                               ((Handle<(vk::HandleType)7>)
                                                outputBufferCreateInfo._40_8_);
                                HVar8.m_internal =
                                     (deUint64)
                                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                                     super_RefBase<vk::VkDevice_s_*>.m_data.object;
                                pHVar26 = (Handle<(vk::HandleType)7> *)operator_new(0x20);
                                pHVar26[2].m_internal = HVar8.m_internal;
                                pHVar26[3].m_internal = 0;
                                pHVar26->m_internal = HVar25.m_internal;
                                pHVar26[1].m_internal = vk.m_internal;
                                imageMipTailBindInfo.bindCount = 0;
                                imageMipTailBindInfo._12_4_ = 0;
                                imageMipTailBindInfo.image.m_internal = (deUint64)pHVar26;
                                imageMipTailBindInfo._8_8_ = operator_new(0x20);
                                *(undefined4 *)(imageMipTailBindInfo._8_8_ + 8) = 0;
                                *(undefined4 *)(imageMipTailBindInfo._8_8_ + 0xc) = 0;
                                *(undefined ***)imageMipTailBindInfo._8_8_ =
                                     &PTR__SharedPtrState_00d24750;
                                *(Handle<(vk::HandleType)7> **)(imageMipTailBindInfo._8_8_ + 0x10) =
                                     pHVar26;
                                *(undefined4 *)(imageMipTailBindInfo._8_8_ + 8) = 1;
                                *(undefined4 *)(imageMipTailBindInfo._8_8_ + 0xc) = 1;
                                std::
                                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                                ::
                                emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                                          ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                                            *)&deviceMemUniquePtrVec,
                                           (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>
                                            *)&imageMipTailBindInfo);
                                uVar18 = (uint)local_748;
                                if (imageMipTailBindInfo._8_8_ != 0) {
                                  LOCK();
                                  piVar1 = (int *)(imageMipTailBindInfo._8_8_ + 8);
                                  *piVar1 = *piVar1 + -1;
                                  UNLOCK();
                                  if (*piVar1 == 0) {
                                    imageMipTailBindInfo.image.m_internal = 0;
                                    (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 0x10))();
                                  }
                                  LOCK();
                                  piVar1 = (int *)(imageMipTailBindInfo._8_8_ + 0xc);
                                  *piVar1 = *piVar1 + -1;
                                  UNLOCK();
                                  if (*piVar1 == 0) {
                                    if (imageMipTailBindInfo._8_8_ != 0) {
                                      (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 8))();
                                    }
                                    imageMipTailBindInfo.bindCount = 0;
                                    imageMipTailBindInfo._12_4_ = 0;
                                  }
                                }
                                if (imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ==
                                    imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  std::
                                  vector<vk::VkSparseImageMemoryBind,std::allocator<vk::VkSparseImageMemoryBind>>
                                  ::_M_realloc_insert<vk::VkSparseImageMemoryBind_const&>
                                            ((vector<vk::VkSparseImageMemoryBind,std::allocator<vk::VkSparseImageMemoryBind>>
                                              *)&imageResidencyMemoryBinds,
                                             (iterator)
                                             imageResidencyMemoryBinds.
                                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,
                                             (VkSparseImageMemoryBind *)&outputBufferCreateInfo);
                                }
                                else {
                                  (imageResidencyMemoryBinds.
                                   super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->memoryOffset =
                                       (VkDeviceSize)outputBufferCreateInfo.pQueueFamilyIndices;
                                  *(pointer *)
                                   &(imageResidencyMemoryBinds.
                                     super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->flags =
                                       pVStack_7e0;
                                  *(undefined8 *)
                                   &((imageResidencyMemoryBinds.
                                      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->extent).depth =
                                       outputBufferCreateInfo._32_8_;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->memory).m_internal
                                       = outputBufferCreateInfo._40_8_;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->offset).y =
                                       outputBufferCreateInfo.flags;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->offset).z =
                                       outputBufferCreateInfo._20_4_;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->extent).width =
                                       (undefined4)outputBufferCreateInfo.size;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->extent).height =
                                       outputBufferCreateInfo.size._4_4_;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->subresource).
                                  aspectMask = outputBufferCreateInfo.sType;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->subresource).
                                  mipLevel = outputBufferCreateInfo._4_4_;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->subresource).
                                  arrayLayer = (uint)outputBufferCreateInfo.pNext;
                                  ((imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->offset).x =
                                       outputBufferCreateInfo.pNext._4_4_;
                                  imageResidencyMemoryBinds.
                                  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                  ._M_impl.super__Vector_impl_data._M_finish =
                                       imageResidencyMemoryBinds.
                                       super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                                }
                              }
                              uVar36 = uVar36 + 1;
                              iVar49 = iVar49 + uVar18;
                            } while (uVar36 < uVar48);
                          }
                          uVar16 = (int)local_750 + 1;
                          local_750 = (ulong)uVar16;
                        } while (uVar16 < (uint)local_758);
                      }
                      uVar17 = (int)local_760 + 1;
                      local_760 = (ulong)uVar17;
                    } while (uVar17 < uVar34);
                  }
                  dVar41 = dVar41 + 1;
                } while (dVar41 != uVar37);
              }
              if ((local_5c0 == 0) && (uVar37 < local_4a8)) {
                makeSparseMemoryBind
                          ((VkSparseMemoryBind *)&outputBufferCreateInfo,
                           (DeviceInterface *)vk.m_internal,
                           (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                           super_RefBase<vk::VkDevice_s_*>.m_data.object,VVar5,dVar14,
                           VVar7 * local_7a0 + VVar6);
                local_548.m_internal =
                     (deUint64)
                     ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                               ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._16_8_);
                DStack_540.m_device =
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object;
                DStack_540.m_allocator = (VkAllocationCallbacks *)0x0;
                DStack_540.m_deviceIface = (DeviceInterface *)vk.m_internal;
                pdVar27 = (deUint64 *)operator_new(0x20);
                pdVar27[2] = (deUint64)DStack_540.m_device;
                pdVar27[3] = (deUint64)DStack_540.m_allocator;
                *pdVar27 = local_548.m_internal;
                pdVar27[1] = (deUint64)DStack_540.m_deviceIface;
                local_548.m_internal = 0;
                DStack_540.m_deviceIface = (DeviceInterface *)0x0;
                DStack_540.m_device = (VkDevice)0x0;
                DStack_540.m_allocator = (VkAllocationCallbacks *)0x0;
                imageResidencyBindInfo.bindCount = 0;
                imageResidencyBindInfo._12_4_ = 0;
                imageResidencyBindInfo.image.m_internal = (deUint64)pdVar27;
                imageResidencyBindInfo._8_8_ = operator_new(0x20);
                *(undefined4 *)(imageResidencyBindInfo._8_8_ + 8) = 0;
                *(undefined4 *)(imageResidencyBindInfo._8_8_ + 0xc) = 0;
                *(undefined ***)imageResidencyBindInfo._8_8_ = &PTR__SharedPtrState_00d24750;
                *(deUint64 **)(imageResidencyBindInfo._8_8_ + 0x10) = pdVar27;
                *(undefined4 *)(imageResidencyBindInfo._8_8_ + 8) = 1;
                *(undefined4 *)(imageResidencyBindInfo._8_8_ + 0xc) = 1;
                std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                          ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                            *)&deviceMemUniquePtrVec,
                           (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                           &imageResidencyBindInfo);
                if (imageResidencyBindInfo._8_8_ != 0) {
                  LOCK();
                  piVar1 = (int *)(imageResidencyBindInfo._8_8_ + 8);
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    imageResidencyBindInfo.image.m_internal = 0;
                    (**(code **)(*(long *)imageResidencyBindInfo._8_8_ + 0x10))();
                  }
                  LOCK();
                  piVar1 = (int *)(imageResidencyBindInfo._8_8_ + 0xc);
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    if (imageResidencyBindInfo._8_8_ != 0) {
                      (**(code **)(*(long *)imageResidencyBindInfo._8_8_ + 8))();
                    }
                    imageResidencyBindInfo.bindCount = 0;
                    imageResidencyBindInfo._12_4_ = 0;
                  }
                }
                if (local_548.m_internal != 0) {
                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                            (&DStack_540,(VkDeviceMemory)local_548.m_internal);
                }
                DStack_540.m_device = (VkDevice)0x0;
                DStack_540.m_allocator = (VkAllocationCallbacks *)0x0;
                local_548.m_internal = 0;
                DStack_540.m_deviceIface = (DeviceInterface *)0x0;
                if (imageMipTailMemoryBinds.
                    super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    imageMipTailMemoryBinds.
                    super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
                  _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                            ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>
                              *)&imageMipTailMemoryBinds,
                             (iterator)
                             imageMipTailMemoryBinds.
                             super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (VkSparseMemoryBind *)&outputBufferCreateInfo);
                }
                else {
                  (imageMipTailMemoryBinds.
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->flags = outputBufferCreateInfo.usage
                  ;
                  *(VkSharingMode *)
                   &(imageMipTailMemoryBinds.
                     super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->field_0x24 =
                       outputBufferCreateInfo.sharingMode;
                  ((imageMipTailMemoryBinds.
                    super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->memory).m_internal =
                       outputBufferCreateInfo._16_8_;
                  (imageMipTailMemoryBinds.
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->memoryOffset =
                       outputBufferCreateInfo.size;
                  *(VkStructureType *)
                   &(imageMipTailMemoryBinds.
                     super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->resourceOffset =
                       outputBufferCreateInfo.sType;
                  *(undefined4 *)
                   ((long)&(imageMipTailMemoryBinds.
                            super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->resourceOffset + 4) =
                       outputBufferCreateInfo._4_4_;
                  *(uint *)&(imageMipTailMemoryBinds.
                             super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->size =
                       (uint)outputBufferCreateInfo.pNext;
                  *(deInt32 *)
                   ((long)&(imageMipTailMemoryBinds.
                            super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->size + 4) =
                       outputBufferCreateInfo.pNext._4_4_;
                  imageMipTailMemoryBinds.
                  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       imageMipTailMemoryBinds.
                       super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              local_7a0 = local_7a0 + 1;
            } while (local_7a0 < local_4a4);
          }
          if (((uVar30 & 1) != 0) && (uVar37 < local_4a8)) {
            makeSparseMemoryBind
                      ((VkSparseMemoryBind *)&outputBufferCreateInfo,
                       (DeviceInterface *)vk.m_internal,
                       (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                       super_RefBase<vk::VkDevice_s_*>.m_data.object,VVar5,dVar14,VVar6);
            local_388.m_data.object.m_internal =
                 (deUint64)
                 ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                           ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._16_8_);
            local_388.m_data.deleter.m_device =
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object;
            local_388.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
            local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)vk.m_internal;
            makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>
                      ((sparse *)&imageResidencyBindInfo,
                       (Move<vk::Handle<(vk::HandleType)7>_> *)&local_388);
            std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
            ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                      ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                        *)&deviceMemUniquePtrVec,
                       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                       &imageResidencyBindInfo);
            de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                      ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                       &imageResidencyBindInfo);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_388);
            if (imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
              _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                        ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>> *)
                         &imageMipTailMemoryBinds,
                         (iterator)
                         imageMipTailMemoryBinds.
                         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (VkSparseMemoryBind *)&outputBufferCreateInfo);
            }
            else {
              (imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish)->flags = outputBufferCreateInfo.usage;
              *(VkSharingMode *)
               &(imageMipTailMemoryBinds.
                 super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x24 =
                   outputBufferCreateInfo.sharingMode;
              ((imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_finish)->memory).m_internal =
                   outputBufferCreateInfo._16_8_;
              (imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish)->memoryOffset =
                   outputBufferCreateInfo.size;
              (imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish)->resourceOffset =
                   outputBufferCreateInfo._0_8_;
              (imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish)->size =
                   (VkDeviceSize)outputBufferCreateInfo.pNext;
              imageMipTailMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   imageMipTailMemoryBinds.
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.usage = 0;
          outputBufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
          outputBufferCreateInfo.queueFamilyIndexCount = 0;
          outputBufferCreateInfo._44_4_ = 0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          uVar33 = (long)imageResidencyMemoryBinds.
                         super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)imageResidencyMemoryBinds.
                         super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (uVar33 != 0) {
            imageResidencyBindInfo.image.m_internal = image;
            imageResidencyBindInfo.bindCount = (deUint32)(uVar33 >> 6);
            imageResidencyBindInfo.pBinds =
                 imageResidencyMemoryBinds.
                 super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          local_7d8 = (pointer)(ulong)(uVar33 != 0);
          uVar33 = (long)imageMipTailMemoryBinds.
                         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)imageMipTailMemoryBinds.
                         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (uVar33 != 0) {
            imageMipTailBindInfo.image.m_internal = image;
            imageMipTailBindInfo.bindCount = (int)(uVar33 >> 3) * -0x33333333;
            imageMipTailBindInfo.pBinds =
                 imageMipTailMemoryBinds.
                 super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          outputBufferCreateInfo.pQueueFamilyIndices = (deUint32 *)(ulong)(uVar33 != 0);
          result = (*(*(_func_int ***)vk.m_internal)[0x11])
                             (vk.m_internal,pQVar23->queueHandle,1,&outputBufferCreateInfo);
          ::vk::checkResult(result,
                            "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                            ,0x18b);
        }
        if (imageMipTailMemoryBinds.
            super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(imageMipTailMemoryBinds.
                          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)imageMipTailMemoryBinds.
                                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)imageMipTailMemoryBinds.
                                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (imageResidencyMemoryBinds.
            super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(imageResidencyMemoryBinds.
                          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)imageResidencyMemoryBinds.
                                super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)imageResidencyMemoryBinds.
                                super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (sparseMemoryRequirements.
            super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(sparseMemoryRequirements.
                          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)sparseMemoryRequirements.
                                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)sparseMemoryRequirements.
                                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (dVar14 != 0xffffffff) {
          makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&outputBufferCreateInfo,
                          (DeviceInterface *)vk.m_internal,
                          (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                          super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar24->queueFamilyIndex);
          sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)outputBufferCreateInfo._16_8_;
          sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)outputBufferCreateInfo._0_8_;
          sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)outputBufferCreateInfo.pNext;
          ::vk::allocateCommandBuffer
                    ((Move<vk::VkCommandBuffer_s_*> *)&outputBufferCreateInfo,
                     (DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (VkCommandPool)outputBufferCreateInfo._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
          VVar5 = outputBufferCreateInfo.size;
          uVar11 = outputBufferCreateInfo._16_8_;
          pvVar10 = outputBufferCreateInfo.pNext;
          commandBuffer = outputBufferCreateInfo._0_8_;
          beginCommandBuffer((DeviceInterface *)vk.m_internal,
                             (VkCommandBuffer)outputBufferCreateInfo._0_8_);
          ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
                    ((DescriptorSetLayoutBuilder *)&outputBufferCreateInfo);
          this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                              ((DescriptorSetLayoutBuilder *)&outputBufferCreateInfo,
                               VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
          ::vk::DescriptorSetLayoutBuilder::build
                    ((Move<vk::Handle<(vk::HandleType)19>_> *)&pixelBuffer,this_01,
                     (DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
          imageResidencyMemoryBinds.
          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pixelBuffer._16_8_;
          imageResidencyMemoryBinds.
          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pixelBuffer.m_format;
          imageResidencyMemoryBinds.
          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pixelBuffer.m_size.m_data._0_8_;
          pixelBuffer.m_format.order = R;
          pixelBuffer.m_format.type = SNORM_INT8;
          pixelBuffer.m_size.m_data[0] = 0;
          pixelBuffer.m_size.m_data[1] = 0;
          pixelBuffer.m_size.m_data[2] = 0;
          pixelBuffer.m_pitch.m_data[0] = 0;
          pixelBuffer.m_pitch.m_data[1] = 0;
          pixelBuffer.m_pitch.m_data[2] = 0;
          if (outputBufferCreateInfo.pQueueFamilyIndices != (deUint32 *)0x0) {
            operator_delete(outputBufferCreateInfo.pQueueFamilyIndices,
                            (long)local_7d8 - (long)outputBufferCreateInfo.pQueueFamilyIndices);
          }
          if (outputBufferCreateInfo.size != 0) {
            operator_delete((void *)outputBufferCreateInfo.size,
                            outputBufferCreateInfo._40_8_ - outputBufferCreateInfo.size);
          }
          if (outputBufferCreateInfo._0_8_ != 0) {
            operator_delete((void *)outputBufferCreateInfo._0_8_,
                            outputBufferCreateInfo._16_8_ - outputBufferCreateInfo._0_8_);
          }
          pVVar9 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object;
          this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                     *)((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context)->
                       m_progCollection;
          TVar2 = (TextureFormat)(pixelBuffer.m_size.m_data + 2);
          pixelBuffer.m_format = TVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&pixelBuffer,"comp","");
          cVar28 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   ::find(this_00,(key_type *)&pixelBuffer);
          ::vk::createShaderModule
                    ((Move<vk::Handle<(vk::HandleType)14>_> *)&outputBufferCreateInfo,
                     (DeviceInterface *)vk.m_internal,pVVar9,*(ProgramBinary **)(cVar28._M_node + 2)
                     ,0);
          imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)outputBufferCreateInfo._16_8_
          ;
          imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)outputBufferCreateInfo._0_8_;
          imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          if (pixelBuffer.m_format != TVar2) {
            operator_delete((void *)pixelBuffer.m_format,pixelBuffer._16_8_ + 1);
          }
          makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&outputBufferCreateInfo,
                             (DeviceInterface *)vk.m_internal,
                             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                             super_RefBase<vk::VkDevice_s_*>.m_data.object,
                             (VkDescriptorSetLayout)
                             imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          imageResidencyBindInfo.pBinds = (VkSparseImageMemoryBind *)outputBufferCreateInfo._16_8_;
          imageResidencyBindInfo.image.m_internal = outputBufferCreateInfo._0_8_;
          imageResidencyBindInfo._8_8_ = outputBufferCreateInfo.pNext;
          makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&outputBufferCreateInfo,
                              (DeviceInterface *)vk.m_internal,
                              (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                              super_RefBase<vk::VkDevice_s_*>.m_data.object,
                              (VkPipelineLayout)outputBufferCreateInfo._0_8_,
                              (VkShaderModule)
                              imageMipTailMemoryBinds.
                              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_start,(VkSpecializationInfo *)0x0)
          ;
          imageMipTailBindInfo.pBinds = (VkSparseMemoryBind *)outputBufferCreateInfo._16_8_;
          imageMipTailBindInfo.image.m_internal = outputBufferCreateInfo._0_8_;
          imageMipTailBindInfo._8_8_ = outputBufferCreateInfo.pNext;
          (*(*(_func_int ***)vk.m_internal)[0x4c])
                    (vk.m_internal,commandBuffer,1,outputBufferCreateInfo._0_8_);
          ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&pixelBuffer);
          this_02 = ::vk::DescriptorPoolBuilder::addType
                              ((DescriptorPoolBuilder *)&pixelBuffer,
                               VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
          ::vk::DescriptorPoolBuilder::build
                    ((Move<vk::Handle<(vk::HandleType)21>_> *)&outputBufferCreateInfo,this_02,
                     (DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,1,1);
          subresource.aspectMask = outputBufferCreateInfo.sType;
          subresource.mipLevel = outputBufferCreateInfo._4_4_;
          stack0xfffffffffffffb10 = outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          if (pixelBuffer.m_format != (TextureFormat)0x0) {
            operator_delete((void *)pixelBuffer.m_format,
                            pixelBuffer._16_8_ - (long)pixelBuffer.m_format);
          }
          makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&outputBufferCreateInfo,
                            (DeviceInterface *)vk.m_internal,
                            (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                            super_RefBase<vk::VkDevice_s_*>.m_data.object,
                            (VkDescriptorPool)subresource._0_8_,
                            (VkDescriptorSetLayout)
                            imageResidencyMemoryBinds.
                            super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          VVar6 = outputBufferCreateInfo.size;
          uVar12 = outputBufferCreateInfo._16_8_;
          offset.x = outputBufferCreateInfo.sType;
          offset.y = outputBufferCreateInfo._4_4_;
          stack0xfffffffffffffa00 = (long *)outputBufferCreateInfo.pNext;
          dVar14 = getNumLayers(this->m_imageType,imageSize);
          pVVar9 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object;
          imageViewType = mapImageViewType(this->m_imageType);
          format = ::vk::mapTextureFormat(local_768);
          subresourceRange.levelCount = 1;
          subresourceRange.aspectMask = 1;
          subresourceRange.baseMipLevel = 0;
          subresourceRange.baseArrayLayer = 0;
          subresourceRange.layerCount = dVar14;
          makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&outputBufferCreateInfo,
                        (DeviceInterface *)vk.m_internal,pVVar9,(VkImage)image,imageViewType,format,
                        subresourceRange);
          extent.width = outputBufferCreateInfo.sType;
          extent.height = outputBufferCreateInfo._4_4_;
          stack0xfffffffffffffaf0 = outputBufferCreateInfo.pNext;
          ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                    ((DescriptorSetUpdateBuilder *)&outputBufferCreateInfo);
          this_03 = (DescriptorSetUpdateBuilder *)
                    ::vk::DescriptorSetUpdateBuilder::write
                              ((DescriptorSetUpdateBuilder *)&outputBufferCreateInfo,offset.x,
                               (void *)0x0,0);
          ::vk::DescriptorSetUpdateBuilder::update
                    (this_03,(DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object);
          if (outputBufferCreateInfo.pQueueFamilyIndices != (deUint32 *)0x0) {
            operator_delete(outputBufferCreateInfo.pQueueFamilyIndices,
                            (long)local_7d8 - (long)outputBufferCreateInfo.pQueueFamilyIndices);
          }
          if (outputBufferCreateInfo.size != 0) {
            operator_delete((void *)outputBufferCreateInfo.size,
                            outputBufferCreateInfo._40_8_ - outputBufferCreateInfo.size);
          }
          std::
          vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
          ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                     *)&outputBufferCreateInfo);
          (*(*(_func_int ***)vk.m_internal)[0x56])
                    (vk.m_internal,commandBuffer,1,imageResidencyBindInfo.image.m_internal,0,1,
                     &offset,0,0);
          dVar41 = pQVar24->queueFamilyIndex;
          srcQueueFamilyIndex = pQVar23->queueFamilyIndex;
          if (pQVar23->queueFamilyIndex == pQVar24->queueFamilyIndex) {
            dVar41 = 0xffffffff;
            srcQueueFamilyIndex = 0xffffffff;
          }
          subresourceRange_00.levelCount = 1;
          subresourceRange_00.aspectMask = 1;
          subresourceRange_00.baseMipLevel = 0;
          subresourceRange_00.baseArrayLayer = 0;
          subresourceRange_00.layerCount = dVar14;
          makeImageMemoryBarrier
                    ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0,0x40,
                     VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,srcQueueFamilyIndex,dVar41,
                     (VkImage)image,subresourceRange_00);
          (*(*(_func_int ***)vk.m_internal)[0x6d])
                    (vk.m_internal,commandBuffer,1,0x800,0,0,0,0,0,1,
                     (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
          getShaderGridSize((sparse *)&gridSize,this->m_imageType,imageSize,0);
          uVar18 = 0x80;
          if (gridSize.m_data[0] < 0x80) {
            uVar18 = gridSize.m_data[0];
          }
          uVar30 = (uint)(byte)(0x80 / (byte)uVar18);
          if (gridSize.m_data[1] < uVar30) {
            uVar30 = gridSize.m_data[1];
          }
          uVar46 = 0x80 / (uVar30 * uVar18 & 0xffff);
          if (gridSize.m_data[2] < uVar46) {
            uVar46 = gridSize.m_data[2];
          }
          uVar33 = 0x40;
          if (uVar46 < 0x40) {
            uVar33 = (ulong)uVar46;
          }
          uVar46 = (gridSize.m_data[0] / uVar18 + 1) - (uint)(gridSize.m_data[0] % uVar18 == 0);
          uVar30 = (gridSize.m_data[1] / uVar30 + 1) - (uint)(gridSize.m_data[1] % uVar30 == 0);
          uVar18 = ((int)(gridSize.m_data[2] / uVar33) + 1) -
                   (uint)((int)((ulong)gridSize.m_data[2] % uVar33) == 0);
          if (0xffff < (uVar30 | uVar46 | uVar18)) {
            pNVar29 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (pNVar29,"Image size is not supported",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                       ,0x1d3);
            __cxa_throw(pNVar29,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          (*(*(_func_int ***)vk.m_internal)[0x5d])
                    (vk.m_internal,commandBuffer,(ulong)uVar46,(ulong)uVar30,(ulong)uVar18);
          subresourceRange_01.levelCount = 1;
          subresourceRange_01.aspectMask = 1;
          subresourceRange_01.baseMipLevel = 0;
          subresourceRange_01.baseArrayLayer = 0;
          subresourceRange_01.layerCount = dVar14;
          makeImageMemoryBarrier
                    ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0x40,0x800,
                     VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)image,
                     subresourceRange_01);
          (*(*(_func_int ***)vk.m_internal)[0x6d])
                    (vk.m_internal,commandBuffer,0x800,0x1000,0,0,0,0,0,1,
                     (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
          dVar14 = getNumPixels(this->m_imageType,imageSize);
          iVar15 = tcu::getPixelSize(*local_768);
          uVar33 = (ulong)(iVar15 * dVar14);
          makeBufferCreateInfo(&outputBufferCreateInfo,uVar33,2);
          ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pixelBuffer,
                             (DeviceInterface *)vk.m_internal,
                             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                             super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                             (VkAllocationCallbacks *)0x0);
          buffer = pixelBuffer.m_format;
          DStack_450.m_device = (VkDevice)pixelBuffer._16_8_;
          DStack_450.m_allocator = (VkAllocationCallbacks *)pixelBuffer.m_pitch.m_data._4_8_;
          DStack_450.m_deviceIface = (DeviceInterface *)pixelBuffer.m_size.m_data._0_8_;
          bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&pixelBuffer,
                     (DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (this->super_SparseResourcesBaseInstance).m_allocator.
                     super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                     (VkBuffer)pixelBuffer.m_format,(MemoryRequirement)0x1);
          local_740 = pixelBuffer.m_format;
          VVar52.height = 0;
          VVar52.width = local_4b4.depth;
          VVar52.depth = local_4a4;
          makeBufferImageCopy((VkBufferImageCopy *)&pixelBuffer,(sparse *)local_4b4._0_8_,VVar52,0,0
                              ,in_stack_fffffffffffff7a8);
          (*(*(_func_int ***)vk.m_internal)[99])
                    (vk.m_internal,commandBuffer,image,6,buffer,1,
                     (int)(VkBufferImageCopy *)&pixelBuffer);
          makeBufferMemoryBarrier
                    ((VkBufferMemoryBarrier *)&pixelBuffer,0x1000,0x2000,(VkBuffer)buffer,0,uVar33);
          (*(*(_func_int ***)vk.m_internal)[0x6d])
                    (vk.m_internal,commandBuffer,0x1000,0x4000,0,0,0,1,
                     (VkBufferMemoryBarrier *)&pixelBuffer,0,0);
          endCommandBuffer((DeviceInterface *)vk.m_internal,(VkCommandBuffer)commandBuffer);
          TVar2 = local_740;
          stageBits[0] = 0x800;
          submitCommandsAndWait
                    ((DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar24->queueHandle,
                     (VkCommandBuffer)commandBuffer,1,&local_438,stageBits,0,(VkSemaphore *)0x0);
          ::vk::invalidateMappedMemoryRange
                    ((DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (VkDeviceMemory)*(deUint64 *)((long)TVar2 + 8),
                     *(VkDeviceSize *)((long)TVar2 + 0x10),uVar33);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&pixelBuffer,local_768,gridSize.m_data[0],gridSize.m_data[1],gridSize.m_data[2]
                     ,*(void **)((long)TVar2 + 0x18));
          (*(*(_func_int ***)vk.m_internal)[3])(vk.m_internal);
          if (uVar37 == 0) {
            VVar52 = mipLevelExtents(&local_4b4,0);
            uVar18 = local_4a4 * VVar52.depth;
            if (uVar18 != 0) {
              uVar38 = 0;
              uVar33 = VVar52._0_8_ >> 0x20;
              dVar14 = local_4a4;
              local_748 = uVar33;
              do {
                if (uVar33 != 0) {
                  uVar42 = 0;
                  do {
                    iVar15 = (int)uVar42;
                    if (VVar52.width != 0) {
                      iVar44 = (int)(uVar42 * 0x2040811 >> 0x20);
                      uVar33 = 0;
                      do {
                        iVar22 = (int)uVar33;
                        iVar49 = (int)(uVar33 * 0x2040811 >> 0x20);
                        referenceValue.m_data[1] =
                             (((uint)(iVar15 - iVar44) >> 1) + iVar44 >> 6) * -0x7f + iVar15;
                        referenceValue.m_data[0] =
                             (((uint)(iVar22 - iVar49) >> 1) + iVar49 >> 6) * -0x7f + iVar22;
                        referenceValue.m_data[3] = 1;
                        referenceValue.m_data[2] = uVar38 % 0x7f;
                        tcu::ConstPixelBufferAccess::getPixelInt
                                  ((ConstPixelBufferAccess *)&outputValue,(int)&pixelBuffer,iVar22,
                                   iVar15);
                        iVar49 = tcu::getNumUsedChannels(local_768->order);
                        iVar49 = bcmp(&outputValue,&referenceValue,(long)iVar49 << 2);
                        if (iVar49 != 0) {
                          local_790 = local_780;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_790,"Failed","");
                          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                               (pointer)&(__return_storage_ptr__->m_description).field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&__return_storage_ptr__->m_description,local_790,
                                     local_788 + (long)local_790);
                          goto LAB_0075dd22;
                        }
                        uVar33 = (ulong)(iVar22 + 1U);
                      } while (VVar52.width != iVar22 + 1U);
                    }
                    uVar42 = (ulong)(iVar15 + 1U);
                    local_848 = VVar52.height;
                    uVar33 = local_748;
                    dVar14 = local_4a4;
                  } while (iVar15 + 1U != local_848);
                }
                uVar38 = uVar38 + 1;
                uVar18 = dVar14 * VVar52.depth;
              } while (uVar38 < uVar18);
            }
          }
          else {
            VVar52 = mipLevelExtents(&local_4b4,0);
            uVar33 = VVar52._0_8_ & 0xffffffff;
            uVar42 = uVar33 % (local_748 & 0xffffffff);
            uVar43 = VVar52._0_8_ >> 0x20;
            uVar30 = VVar52.depth % uVar4;
            iVar15 = 0;
            uVar18 = 0;
            local_770 = uVar30;
            if (uVar30 == 0) {
              local_770 = uVar4;
            }
            uVar46 = (uint)(uVar43 % (ulong)uVar38);
            uVar37 = uVar46;
            if (uVar46 == 0) {
              uVar37 = uVar38;
            }
            bVar13 = (int)uVar42 != 0;
            if (!bVar13) {
              uVar42 = local_748 & 0xffffffff;
            }
            if (local_4a4 != 0) {
              uVar45 = (int)(uVar33 / (local_748 & 0xffffffff)) + (uint)bVar13;
              uVar48 = (int)(uVar43 / uVar38) + (uint)(uVar46 != 0);
              uVar30 = VVar52.depth / uVar4 + (uint)(uVar30 != 0);
              uVar33 = (ulong)uVar30;
              local_76c = uVar45 - 1;
              uVar18 = uVar4 * uVar30;
              uVar46 = 0;
              local_408 = uVar33;
              dVar14 = local_4a4;
              do {
                if ((int)uVar33 != 0) {
                  local_418 = (ulong)(uVar46 * (int)uVar33);
                  uVar34 = 0;
                  iVar44 = iVar15;
                  do {
                    if (uVar48 != 0) {
                      iVar49 = uVar34 + (int)local_418;
                      uVar16 = iVar49 * uVar4;
                      uVar17 = uVar4;
                      if (uVar34 == uVar30 - 1) {
                        uVar17 = local_770;
                      }
                      local_410 = (ulong)(iVar49 * uVar48);
                      local_760 = CONCAT44(local_760._4_4_,uVar16 + uVar17);
                      iVar49 = 0;
                      uVar36 = 0;
                      do {
                        if (uVar45 != 0) {
                          uVar50 = uVar36 * uVar38;
                          uVar40 = uVar38;
                          if (uVar36 == uVar48 - 1) {
                            uVar40 = uVar37;
                          }
                          iVar31 = (int)local_410;
                          local_758 = CONCAT44(local_758._4_4_,uVar50 + uVar40);
                          local_750 = (ulong)(uVar40 + iVar49);
                          iVar22 = 0;
                          uVar40 = 0;
                          do {
                            uVar35 = uVar40 * (uint)local_748;
                            uVar33 = local_748 & 0xffffffff;
                            if (uVar40 == local_76c) {
                              uVar33 = uVar42;
                            }
                            iVar32 = (int)uVar33;
                            if (((iVar31 + uVar36) * uVar45 + uVar40 & 1) == 0) {
                              if (uVar16 < (uint)local_760) {
                                uVar43 = (ulong)uVar16;
                                do {
                                  iVar51 = (int)uVar43;
                                  if (uVar50 < (uint)local_758) {
                                    iVar21 = (int)(uVar43 * 0x2040811 >> 0x20);
                                    uVar43 = (ulong)uVar50;
                                    do {
                                      z = (int)uVar43;
                                      if (uVar35 < uVar35 + iVar32) {
                                        iVar19 = (int)(uVar43 * 0x2040811 >> 0x20);
                                        uVar43 = uVar33;
                                        uVar39 = uVar35;
                                        do {
                                          referenceValue.m_data[1] =
                                               (((uint)(z - iVar19) >> 1) + iVar19 >> 6) * -0x7f + z
                                          ;
                                          referenceValue.m_data[0] = uVar39 % 0x7f;
                                          referenceValue.m_data[3] = 1;
                                          referenceValue.m_data[2] =
                                               (((uint)(iVar51 - iVar21) >> 1) + iVar21 >> 6) *
                                               -0x7f + iVar51;
                                          tcu::ConstPixelBufferAccess::getPixelInt
                                                    ((ConstPixelBufferAccess *)&outputValue,
                                                     (int)&pixelBuffer,uVar39,z);
                                          iVar20 = tcu::getNumUsedChannels(local_768->order);
                                          iVar20 = bcmp(&outputValue,&referenceValue,
                                                        (long)iVar20 << 2);
                                          if (iVar20 != 0) {
                                            local_790 = local_780;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_790,"Failed","");
                                            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                                            (__return_storage_ptr__->m_description)._M_dataplus._M_p
                                                 = (pointer)&(__return_storage_ptr__->m_description)
                                                             .field_2;
                                            std::__cxx11::string::_M_construct<char*>
                                                      ((string *)
                                                       &__return_storage_ptr__->m_description,
                                                       local_790,local_788 + (long)local_790);
                                            goto LAB_0075dd22;
                                          }
                                          uVar39 = uVar39 + 1;
                                          uVar47 = (int)uVar43 - 1;
                                          uVar43 = (ulong)uVar47;
                                        } while (uVar47 != 0);
                                      }
                                      uVar43 = (ulong)(z + 1U);
                                    } while (z + 1U != (uint)local_750);
                                  }
                                  uVar43 = (ulong)(iVar51 + 1U);
                                } while (iVar51 + 1U != uVar17 + iVar44);
                              }
                            }
                            else if ((physicalDeviceProperties.sparseProperties.
                                      residencyNonResidentStrict != 0) && (uVar16 < (uint)local_760)
                                    ) {
                              uVar33 = (ulong)uVar16;
                              do {
                                uVar43 = (ulong)uVar50;
                                if (uVar50 < (uint)local_758) {
                                  do {
                                    if (uVar35 < iVar32 + uVar35) {
                                      iVar51 = 0;
                                      do {
                                        referenceValue.m_data[0] = 0;
                                        referenceValue.m_data[1] = 0;
                                        referenceValue.m_data[2] = 0;
                                        referenceValue.m_data[3] = 0;
                                        tcu::ConstPixelBufferAccess::getPixelInt
                                                  ((ConstPixelBufferAccess *)&outputValue,
                                                   (int)&pixelBuffer,iVar51 + iVar22,(int)uVar43);
                                        iVar21 = tcu::getNumUsedChannels(local_768->order);
                                        iVar21 = bcmp(&outputValue,&referenceValue,(long)iVar21 << 2
                                                     );
                                        if (iVar21 != 0) {
                                          local_790 = local_780;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_790,"Failed","");
                                          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                                          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                                               (pointer)&(__return_storage_ptr__->m_description).
                                                         field_2;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)
                                                     &__return_storage_ptr__->m_description,
                                                     local_790,local_788 + (long)local_790);
                                          goto LAB_0075dd22;
                                        }
                                        iVar51 = iVar51 + 1;
                                      } while (iVar32 != iVar51);
                                    }
                                    uVar39 = (int)uVar43 + 1;
                                    uVar43 = (ulong)uVar39;
                                  } while (uVar39 != (uint)local_750);
                                }
                                uVar39 = (int)uVar33 + 1;
                                uVar33 = (ulong)uVar39;
                              } while (uVar39 != uVar17 + iVar44);
                            }
                            uVar40 = uVar40 + 1;
                            iVar22 = iVar22 + (uint)local_748;
                            uVar33 = local_408;
                          } while (uVar40 < uVar45);
                        }
                        uVar36 = uVar36 + 1;
                        iVar49 = iVar49 + uVar38;
                      } while (uVar36 < uVar48);
                    }
                    uVar34 = uVar34 + 1;
                    iVar44 = iVar44 + uVar4;
                    dVar14 = local_4a4;
                  } while (uVar34 < (uint)uVar33);
                }
                uVar46 = uVar46 + 1;
                iVar15 = iVar15 + uVar18;
              } while (uVar46 < dVar14);
            }
          }
          local_790 = local_780;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"Passed","",uVar18);
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_790,
                     local_788 + (long)local_790);
LAB_0075dd22:
          if (local_790 != local_780) {
            operator_delete(local_790,local_780[0] + 1);
          }
          if (local_740 != (TextureFormat)0x0) {
            (**(code **)(*(long *)local_740 + 8))();
          }
          if (buffer != (TextureFormat)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                      (&DStack_450,(VkBuffer)buffer);
          }
          if (extent._0_8_ != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&extent.depth,
                       (VkImageView)extent._0_8_);
          }
          if (offset._0_8_ != 0) {
            outputBufferCreateInfo.sType = offset.x;
            outputBufferCreateInfo._4_4_ = offset.y;
            (**(code **)(*stack0xfffffffffffffa00 + 0x1e8))(stack0xfffffffffffffa00,uVar12,VVar6,1);
          }
          if (subresource._0_8_ != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&subresource.arrayLayer,
                       (VkDescriptorPool)subresource._0_8_);
          }
          if (imageMipTailBindInfo.image.m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&imageMipTailBindInfo.bindCount,
                       (VkPipeline)imageMipTailBindInfo.image.m_internal);
          }
          if (imageResidencyBindInfo.image.m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&imageResidencyBindInfo.bindCount
                       ,(VkPipelineLayout)imageResidencyBindInfo.image.m_internal);
          }
          if (imageMipTailMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
                       &imageMipTailMemoryBinds.
                        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (VkShaderModule)
                       imageMipTailMemoryBinds.
                       super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          if (imageResidencyMemoryBinds.
              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)19>_> *)
                       &imageResidencyMemoryBinds.
                        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (VkDescriptorSetLayout)
                       imageResidencyMemoryBinds.
                       super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          if (commandBuffer != 0) {
            outputBufferCreateInfo._0_8_ = commandBuffer;
            (**(code **)(*pvVar10 + 0x240))(pvVar10,uVar11,VVar5,1);
          }
          if (sparseMemoryRequirements.
              super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
                       &sparseMemoryRequirements.
                        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (VkCommandPool)
                       sparseMemoryRequirements.
                       super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_438.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                    (&DStack_430,local_438);
        }
        if (image != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    (&DStack_560,(VkImage)image);
        }
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
        ::~vector(&deviceMemUniquePtrVec);
        return __return_storage_ptr__;
      }
      pNVar29 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar29,"The image format does not support sparse operations",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                 ,0xee);
    }
    else {
      pNVar29 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar29,"Sparse residency for image type is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                 ,0xd4);
    }
  }
  else {
    pNVar29 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar29,"Image size not supported for device",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0xd0);
  }
  __cxa_throw(pNVar29,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus ImageSparseResidencyInstance::iterate (void)
{
	const InstanceInterface&			instance = m_context.getInstanceInterface();
	const VkPhysicalDevice				physicalDevice = m_context.getPhysicalDevice();
	const VkPhysicalDeviceProperties	physicalDeviceProperties = getPhysicalDeviceProperties(instance, physicalDevice);
	VkImageCreateInfo					imageCreateInfo;
	VkSparseImageMemoryRequirements		aspectRequirements;
	VkExtent3D							imageGranularity;
	std::vector<DeviceMemorySp>			deviceMemUniquePtrVec;

	// Check if image size does not exceed device limits
	if (!isImageSizeSupported(instance, physicalDevice, m_imageType, m_imageSize))
		TCU_THROW(NotSupportedError, "Image size not supported for device");

	// Check if device supports sparse operations for image type
	if (!checkSparseSupportForImageType(instance, physicalDevice, m_imageType))
		TCU_THROW(NotSupportedError, "Sparse residency for image type is not supported");

	imageCreateInfo.sType					= VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	imageCreateInfo.pNext					= DE_NULL;
	imageCreateInfo.flags					= VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT | VK_IMAGE_CREATE_SPARSE_BINDING_BIT;
	imageCreateInfo.imageType				= mapImageType(m_imageType);
	imageCreateInfo.format					= mapTextureFormat(m_format);
	imageCreateInfo.extent					= makeExtent3D(getLayerSize(m_imageType, m_imageSize));
	imageCreateInfo.mipLevels				= 1u;
	imageCreateInfo.arrayLayers				= getNumLayers(m_imageType, m_imageSize);
	imageCreateInfo.samples					= VK_SAMPLE_COUNT_1_BIT;
	imageCreateInfo.tiling					= VK_IMAGE_TILING_OPTIMAL;
	imageCreateInfo.initialLayout			= VK_IMAGE_LAYOUT_UNDEFINED;
	imageCreateInfo.usage					= VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
											  VK_IMAGE_USAGE_STORAGE_BIT;
	imageCreateInfo.sharingMode				= VK_SHARING_MODE_EXCLUSIVE;
	imageCreateInfo.queueFamilyIndexCount	= 0u;
	imageCreateInfo.pQueueFamilyIndices		= DE_NULL;

	if (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY)
	{
		imageCreateInfo.flags |= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
	}

	// Check if device supports sparse operations for image format
	if (!checkSparseSupportForImageFormat(instance, physicalDevice, imageCreateInfo))
		TCU_THROW(NotSupportedError, "The image format does not support sparse operations");

	{
		// Create logical device supporting both sparse and compute queues
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	// Create sparse image
	const Unique<VkImage> sparseImage(createImage(deviceInterface, getDevice(), &imageCreateInfo));

	// Create sparse image memory bind semaphore
	const Unique<VkSemaphore> imageMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	{
		// Get image general memory requirements
		const VkMemoryRequirements imageMemoryRequirements = getImageMemoryRequirements(deviceInterface, getDevice(), *sparseImage);

		if (imageMemoryRequirements.size > physicalDeviceProperties.limits.sparseAddressSpaceSize)
			TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits");

		DE_ASSERT((imageMemoryRequirements.size % imageMemoryRequirements.alignment) == 0);

		// Get sparse image sparse memory requirements
		const std::vector<VkSparseImageMemoryRequirements> sparseMemoryRequirements = getImageSparseMemoryRequirements(deviceInterface, getDevice(), *sparseImage);

		DE_ASSERT(sparseMemoryRequirements.size() != 0);

		const deUint32 colorAspectIndex = getSparseAspectRequirementsIndex(sparseMemoryRequirements, VK_IMAGE_ASPECT_COLOR_BIT);

		if (colorAspectIndex == NO_MATCH_FOUND)
			TCU_THROW(NotSupportedError, "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT");

		aspectRequirements	= sparseMemoryRequirements[colorAspectIndex];
		imageGranularity	= aspectRequirements.formatProperties.imageGranularity;

		const VkImageAspectFlags aspectMask = aspectRequirements.formatProperties.aspectMask;

		DE_ASSERT((aspectRequirements.imageMipTailSize % imageMemoryRequirements.alignment) == 0);

		std::vector<VkSparseImageMemoryBind> imageResidencyMemoryBinds;
		std::vector<VkSparseMemoryBind>		 imageMipTailMemoryBinds;

		const deUint32						 memoryType = findMatchingMemoryType(instance, physicalDevice, imageMemoryRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		// Bind device memory for each aspect
		for (deUint32 layerNdx = 0; layerNdx < imageCreateInfo.arrayLayers; ++layerNdx)
		{
			for (deUint32 mipLevelNdx = 0; mipLevelNdx < aspectRequirements.imageMipTailFirstLod; ++mipLevelNdx)
			{
				const VkImageSubresource subresource		= { aspectMask, mipLevelNdx, layerNdx };
				const VkExtent3D		 mipExtent			= mipLevelExtents(imageCreateInfo.extent, mipLevelNdx);
				const tcu::UVec3		 numSparseBinds		= alignedDivide(mipExtent, imageGranularity);
				const tcu::UVec3		 lastBlockExtent	= tcu::UVec3(mipExtent.width  % imageGranularity.width  ? mipExtent.width   % imageGranularity.width  : imageGranularity.width,
																		 mipExtent.height % imageGranularity.height ? mipExtent.height  % imageGranularity.height : imageGranularity.height,
																		 mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth   % imageGranularity.depth  : imageGranularity.depth);
				for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
				for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
				for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
				{
					const deUint32 linearIndex = x + y*numSparseBinds.x() + z*numSparseBinds.x()*numSparseBinds.y() + layerNdx*numSparseBinds.x()*numSparseBinds.y()*numSparseBinds.z();

					if (linearIndex % 2u == 1u)
					{
						continue;
					}

					VkOffset3D offset;
					offset.x = x*imageGranularity.width;
					offset.y = y*imageGranularity.height;
					offset.z = z*imageGranularity.depth;

					VkExtent3D extent;
					extent.width  = (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
					extent.height = (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
					extent.depth  = (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

					const VkSparseImageMemoryBind imageMemoryBind = makeSparseImageMemoryBind(deviceInterface, getDevice(),
						imageMemoryRequirements.alignment, memoryType, subresource, offset, extent);

					deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

					imageResidencyMemoryBinds.push_back(imageMemoryBind);
				}
			}

			if (!(aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) && aspectRequirements.imageMipTailFirstLod < imageCreateInfo.mipLevels)
			{
				const VkSparseMemoryBind imageMipTailMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
					aspectRequirements.imageMipTailSize, memoryType, aspectRequirements.imageMipTailOffset + layerNdx * aspectRequirements.imageMipTailStride);

				deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMipTailMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

				imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
			}
		}

		if ((aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) && aspectRequirements.imageMipTailFirstLod < imageCreateInfo.mipLevels)
		{
			const VkSparseMemoryBind imageMipTailMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
				aspectRequirements.imageMipTailSize, memoryType, aspectRequirements.imageMipTailOffset);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMipTailMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
		}

		VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		VkSparseImageMemoryBindInfo		  imageResidencyBindInfo;
		VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;

		if (imageResidencyMemoryBinds.size() > 0)
		{
			imageResidencyBindInfo.image		= *sparseImage;
			imageResidencyBindInfo.bindCount	= static_cast<deUint32>(imageResidencyMemoryBinds.size());
			imageResidencyBindInfo.pBinds		= &imageResidencyMemoryBinds[0];

			bindSparseInfo.imageBindCount		= 1u;
			bindSparseInfo.pImageBinds			= &imageResidencyBindInfo;
		}

		if (imageMipTailMemoryBinds.size() > 0)
		{
			imageMipTailBindInfo.image			= *sparseImage;
			imageMipTailBindInfo.bindCount		= static_cast<deUint32>(imageMipTailMemoryBinds.size());
			imageMipTailBindInfo.pBinds			= &imageMipTailMemoryBinds[0];

			bindSparseInfo.imageOpaqueBindCount = 1u;
			bindSparseInfo.pImageOpaqueBinds	= &imageMipTailBindInfo;
		}

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for compute and transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	// Create descriptor set layout
	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, getDevice()));

	// Create and bind compute pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("comp"), DE_NULL));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));
	const Unique<VkPipeline>		computePipeline(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule));

	deviceInterface.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	// Create and bind descriptor set
	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 1u)
		.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet>	descriptorSet(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));

	const VkImageSubresourceRange	subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));
	const Unique<VkImageView>		imageView(makeImageView(deviceInterface, getDevice(), *sparseImage, mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange));
	const VkDescriptorImageInfo		sparseImageInfo  = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &sparseImageInfo)
		.update(deviceInterface, getDevice());

	deviceInterface.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	{
		const VkImageMemoryBarrier sparseImageLayoutChangeBarrier = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? sparseQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? computeQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			*sparseImage,
			subresourceRange
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &sparseImageLayoutChangeBarrier);
	}

	const tcu::UVec3  gridSize = getShaderGridSize(m_imageType, m_imageSize);

	{
		const tcu::UVec3  workGroupSize = computeWorkGroupSize(gridSize);

		const deUint32 xWorkGroupCount = gridSize.x() / workGroupSize.x() + (gridSize.x() % workGroupSize.x() ? 1u : 0u);
		const deUint32 yWorkGroupCount = gridSize.y() / workGroupSize.y() + (gridSize.y() % workGroupSize.y() ? 1u : 0u);
		const deUint32 zWorkGroupCount = gridSize.z() / workGroupSize.z() + (gridSize.z() % workGroupSize.z() ? 1u : 0u);

		const tcu::UVec3 maxComputeWorkGroupCount = tcu::UVec3(65535u, 65535u, 65535u);

		if (maxComputeWorkGroupCount.x() < xWorkGroupCount ||
			maxComputeWorkGroupCount.y() < yWorkGroupCount ||
			maxComputeWorkGroupCount.z() < zWorkGroupCount)
		{
			TCU_THROW(NotSupportedError, "Image size is not supported");
		}

		deviceInterface.cmdDispatch(*commandBuffer, xWorkGroupCount, yWorkGroupCount, zWorkGroupCount);
	}

	{
		const VkImageMemoryBarrier sparseImageTrasferBarrier = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*sparseImage,
			subresourceRange
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &sparseImageTrasferBarrier);
	}

	const deUint32					imageSizeInBytes		= getNumPixels(m_imageType, m_imageSize) * tcu::getPixelSize(m_format);
	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	{
		const VkBufferImageCopy bufferImageCopy = makeBufferImageCopy(imageCreateInfo.extent, imageCreateInfo.arrayLayers);

		deviceInterface.cmdCopyImageToBuffer(*commandBuffer, *sparseImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &bufferImageCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferHostReadBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_HOST_READ_BIT,
			*outputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferHostReadBarrier, 0u, DE_NULL);
	}

	// End recording commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	// The stage at which execution is going to wait for finish of sparse binding operations
	const VkPipelineStageFlags stageBits[] = { VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT };

	// Submit commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &imageMemoryBindSemaphore.get(), stageBits);

	// Retrieve data from buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), imageSizeInBytes);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());
	const tcu::ConstPixelBufferAccess pixelBuffer = tcu::ConstPixelBufferAccess(m_format, gridSize.x(), gridSize.y(), gridSize.z(), outputData);

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Validate results
	if( aspectRequirements.imageMipTailFirstLod > 0u )
	{
		const VkExtent3D		 mipExtent		 = mipLevelExtents(imageCreateInfo.extent, 0u);
		const tcu::UVec3		 numSparseBinds  = alignedDivide(mipExtent, imageGranularity);
		const tcu::UVec3		 lastBlockExtent = tcu::UVec3(	mipExtent.width  % imageGranularity.width  ? mipExtent.width  % imageGranularity.width  : imageGranularity.width,
																mipExtent.height % imageGranularity.height ? mipExtent.height % imageGranularity.height : imageGranularity.height,
																mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth  % imageGranularity.depth  : imageGranularity.depth);

		for (deUint32 layerNdx = 0; layerNdx < imageCreateInfo.arrayLayers; ++layerNdx)
		{
			for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
			for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
			for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
			{
				VkExtent3D offset;
				offset.width  = x*imageGranularity.width;
				offset.height = y*imageGranularity.height;
				offset.depth  = z*imageGranularity.depth + layerNdx*numSparseBinds.z()*imageGranularity.depth;

				VkExtent3D extent;
				extent.width  = (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
				extent.height = (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
				extent.depth  = (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

				const deUint32 linearIndex = x + y*numSparseBinds.x() + z*numSparseBinds.x()*numSparseBinds.y() + layerNdx*numSparseBinds.x()*numSparseBinds.y()*numSparseBinds.z();

				if (linearIndex % 2u == 0u)
				{
					for (deUint32 offsetZ = offset.depth;  offsetZ < offset.depth  + extent.depth;  ++offsetZ)
					for (deUint32 offsetY = offset.height; offsetY < offset.height + extent.height; ++offsetY)
					for (deUint32 offsetX = offset.width;  offsetX < offset.width  + extent.width;  ++offsetX)
					{
						const tcu::UVec4 referenceValue = tcu::UVec4(offsetX % 127u, offsetY % 127u, offsetZ % 127u, 1u);
						const tcu::UVec4 outputValue	= pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

						if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
							return tcu::TestStatus::fail("Failed");
					}
				}
				else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict)
				{
					for (deUint32 offsetZ = offset.depth;  offsetZ < offset.depth  + extent.depth;  ++offsetZ)
					for (deUint32 offsetY = offset.height; offsetY < offset.height + extent.height; ++offsetY)
					for (deUint32 offsetX = offset.width;  offsetX < offset.width  + extent.width;  ++offsetX)
					{
						const tcu::UVec4 referenceValue = tcu::UVec4(0u, 0u, 0u, 0u);
						const tcu::UVec4 outputValue = pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

						if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
							return tcu::TestStatus::fail("Failed");
					}
				}
			}
		}
	}
	else
	{
		const VkExtent3D mipExtent = mipLevelExtents(imageCreateInfo.extent, 0u);

		for (deUint32 offsetZ = 0u; offsetZ < mipExtent.depth * imageCreateInfo.arrayLayers; ++offsetZ)
		for (deUint32 offsetY = 0u; offsetY < mipExtent.height; ++offsetY)
		for (deUint32 offsetX = 0u; offsetX < mipExtent.width;  ++offsetX)
		{
			const tcu::UVec4 referenceValue = tcu::UVec4(offsetX % 127u, offsetY % 127u, offsetZ % 127u, 1u);
			const tcu::UVec4 outputValue	= pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

			if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
				return tcu::TestStatus::fail("Failed");
		}
	}

	return tcu::TestStatus::pass("Passed");
}